

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLQuaternion.cpp
# Opt level: O2

Quaternion * AML::operator/(Quaternion *__return_storage_ptr__,Quaternion *lhs,double s)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  auVar2._8_8_ = s;
  auVar2._0_8_ = s;
  auVar2 = divpd(*(undefined1 (*) [16])&lhs->field_0,auVar2);
  *(undefined1 (*) [16])&__return_storage_ptr__->field_0 = auVar2;
  auVar1._8_8_ = s;
  auVar1._0_8_ = s;
  auVar2 = divpd(*(undefined1 (*) [16])((long)&lhs->field_0 + 0x10),auVar1);
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->field_0 + 0x10) = auVar2;
  return __return_storage_ptr__;
}

Assistant:

Quaternion operator/(const Quaternion& lhs, double s) { return (Quaternion(lhs) /= s); }